

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void * POOL_thread(void *opaque)

{
  pthread_mutex_t *__mutex;
  code *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  
  if (opaque == (void *)0x0) {
    return (void *)0x0;
  }
  __mutex = (pthread_mutex_t *)((long)opaque + 0x60);
  do {
    pthread_mutex_lock(__mutex);
    while ((*(int *)((long)opaque + 0x58) != 0 ||
           (*(ulong *)((long)opaque + 0x28) <= *(ulong *)((long)opaque + 0x50)))) {
      if (*(int *)((long)opaque + 0xe8) != 0) {
        pthread_mutex_unlock(__mutex);
        return opaque;
      }
      pthread_cond_wait((pthread_cond_t *)((long)opaque + 0xb8),__mutex);
    }
    lVar4 = *(long *)((long)opaque + 0x38) * 0x10;
    pcVar1 = *(code **)(*(long *)((long)opaque + 0x30) + lVar4);
    uVar2 = *(undefined8 *)(*(long *)((long)opaque + 0x30) + 8 + lVar4);
    uVar3 = (*(long *)((long)opaque + 0x38) + 1U) % *(ulong *)((long)opaque + 0x48);
    *(ulong *)((long)opaque + 0x38) = uVar3;
    *(ulong *)((long)opaque + 0x50) = *(ulong *)((long)opaque + 0x50) + 1;
    *(uint *)((long)opaque + 0x58) = (uint)(uVar3 == *(ulong *)((long)opaque + 0x40));
    pthread_cond_signal((pthread_cond_t *)((long)opaque + 0x88));
    pthread_mutex_unlock(__mutex);
    (*pcVar1)(uVar2);
    pthread_mutex_lock(__mutex);
    *(long *)((long)opaque + 0x50) = *(long *)((long)opaque + 0x50) + -1;
    if (*(long *)((long)opaque + 0x48) == 1) {
      pthread_cond_signal((pthread_cond_t *)((long)opaque + 0x88));
    }
    pthread_mutex_unlock(__mutex);
  } while( true );
}

Assistant:

static void* POOL_thread(void* opaque) {
    POOL_ctx* const ctx = (POOL_ctx*)opaque;
    if (!ctx) { return NULL; }
    for (;;) {
        /* Lock the mutex and wait for a non-empty queue or until shutdown */
        ZSTD_pthread_mutex_lock(&ctx->queueMutex);

        while ( ctx->queueEmpty
            || (ctx->numThreadsBusy >= ctx->threadLimit) ) {
            if (ctx->shutdown) {
                /* even if !queueEmpty, (possible if numThreadsBusy >= threadLimit),
                 * a few threads will be shutdown while !queueEmpty,
                 * but enough threads will remain active to finish the queue */
                ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
                return opaque;
            }
            ZSTD_pthread_cond_wait(&ctx->queuePopCond, &ctx->queueMutex);
        }
        /* Pop a job off the queue */
        {   POOL_job const job = ctx->queue[ctx->queueHead];
            ctx->queueHead = (ctx->queueHead + 1) % ctx->queueSize;
            ctx->numThreadsBusy++;
            ctx->queueEmpty = ctx->queueHead == ctx->queueTail;
            /* Unlock the mutex, signal a pusher, and run the job */
            ZSTD_pthread_cond_signal(&ctx->queuePushCond);
            ZSTD_pthread_mutex_unlock(&ctx->queueMutex);

            job.function(job.opaque);

            /* If the intended queue size was 0, signal after finishing job */
            ZSTD_pthread_mutex_lock(&ctx->queueMutex);
            ctx->numThreadsBusy--;
            if (ctx->queueSize == 1) {
                ZSTD_pthread_cond_signal(&ctx->queuePushCond);
            }
            ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
        }
    }  /* for (;;) */
    assert(0);  /* Unreachable */
}